

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::udp_socket::wrap
          (udp_socket *this,endpoint *ep,span<const_char> p,error_code *ec,udp_send_flags_t flags)

{
  bool bVar1;
  pointer data;
  pointer pvVar2;
  unsigned_long size;
  reference pvVar3;
  char *data_00;
  size_t sVar4;
  element_type *this_00;
  int val;
  bool local_1bd;
  endpoint local_1b0;
  undefined1 local_193;
  uchar local_192;
  bitfield_flag local_191;
  undefined1 local_190 [8];
  set_dont_frag df;
  size_t local_178;
  const_buffer local_170;
  undefined1 local_160 [8];
  array<boost::asio::const_buffer,_2UL> iovec;
  char *h;
  array<char,_255UL> header;
  error_code *ec_local;
  endpoint *ep_local;
  udp_socket *this_local;
  undefined1 auStack_18 [7];
  udp_send_flags_t flags_local;
  span<const_char> p_local;
  
  _auStack_18 = p.m_ptr;
  header._M_elems._247_8_ = ec;
  iovec._M_elems[1].size_ =
       (size_t)::std::array<char,_255UL>::data((array<char,_255UL> *)((long)&h + 1));
  write_uint16<int,char*>(0,(char **)&iovec._M_elems[1].size_);
  write_uint8<int,char*>(0,(char **)&iovec._M_elems[1].size_);
  bVar1 = is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>(ep);
  val = 4;
  if (bVar1) {
    val = 1;
  }
  write_uint8<int,char*>(val,(char **)&iovec._M_elems[1].size_);
  write_endpoint<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,char*&>
            (ep,(char **)&iovec._M_elems[1].size_);
  ::std::array<boost::asio::const_buffer,_2UL>::array
            ((array<boost::asio::const_buffer,_2UL> *)local_160);
  data = ::std::array<char,_255UL>::data((array<char,_255UL> *)((long)&h + 1));
  sVar4 = iovec._M_elems[1].size_;
  pvVar2 = ::std::array<char,_255UL>::data((array<char,_255UL> *)((long)&h + 1));
  size = numeric_cast<unsigned_long,long,void>(sVar4 - (long)pvVar2);
  boost::asio::const_buffer::const_buffer(&local_170,data,size);
  pvVar3 = ::std::array<boost::asio::const_buffer,_2UL>::operator[]
                     ((array<boost::asio::const_buffer,_2UL> *)local_160,0);
  pvVar3->data_ = local_170.data_;
  pvVar3->size_ = local_170.size_;
  data_00 = span<const_char>::data((span<const_char> *)auStack_18);
  sVar4 = span<const_char>::size((span<const_char> *)auStack_18);
  boost::asio::const_buffer::const_buffer((const_buffer *)&df.m_df,data_00,sVar4);
  pvVar3 = ::std::array<boost::asio::const_buffer,_2UL>::operator[]
                     ((array<boost::asio::const_buffer,_2UL> *)local_160,1);
  pvVar3->data_ = (void *)df._8_8_;
  pvVar3->size_ = local_178;
  local_193 = 8;
  local_192 = flags.m_val;
  local_191 = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)
                         flags.m_val,
                         (bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)
                         0x8);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_191);
  local_1bd = false;
  if (bVar1) {
    local_1bd = is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>>(ep);
  }
  set_dont_frag::set_dont_frag((set_dont_frag *)local_190,&this->m_socket,local_1bd);
  this_00 = ::std::
            __shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->m_socks5_connection);
  socks5::target(&local_1b0,this_00);
  boost::asio::
  basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
  ::send_to<std::array<boost::asio::const_buffer,2ul>>
            ((basic_datagram_socket<boost::asio::ip::udp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>
              *)this,(array<boost::asio::const_buffer,_2UL> *)local_160,&local_1b0,0,
             (error_code *)header._M_elems._247_8_);
  set_dont_frag::~set_dont_frag((set_dont_frag *)local_190);
  return;
}

Assistant:

void udp_socket::wrap(udp::endpoint const& ep, span<char const> p
	, error_code& ec, udp_send_flags_t const flags)
{
	TORRENT_UNUSED(flags);
	using namespace libtorrent::aux;

	std::array<char, max_header_size> header;
	char* h = header.data();

	write_uint16(0, h); // reserved
	write_uint8(0, h); // fragment
	write_uint8(aux::is_v4(ep) ? 1 : 4, h); // atyp
	write_endpoint(ep, h);

	std::array<boost::asio::const_buffer, 2> iovec;
	iovec[0] = boost::asio::const_buffer(header.data(), aux::numeric_cast<std::size_t>(h - header.data()));
	iovec[1] = boost::asio::const_buffer(p.data(), static_cast<std::size_t>(p.size()));

	// set the DF flag for the socket and clear it again in the destructor
	set_dont_frag df(m_socket, (flags & dont_fragment) && aux::is_v4(ep));

	m_socket.send_to(iovec, m_socks5_connection->target(), 0, ec);
}